

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall fmt::v11::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  int *piVar1;
  uint *puVar2;
  size_t sVar3;
  uint *puVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  
  compare(this,other);
  puVar2 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
  sVar3 = (other->bigits_).super_buffer<unsigned_int>.size_;
  puVar4 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  lVar5 = (long)(other->exp_ - this->exp_);
  lVar6 = lVar5 << 0x20;
  uVar8 = 0;
  for (sVar7 = 0; sVar3 != sVar7; sVar7 = sVar7 + 1) {
    uVar8 = (ulong)puVar4[lVar5 + sVar7] - (uVar8 + puVar2[sVar7]);
    puVar4[lVar5 + sVar7] = (uint)uVar8;
    uVar8 = uVar8 >> 0x3f;
    lVar6 = lVar6 + 0x100000000;
  }
  if ((int)uVar8 != 0) {
    piVar1 = (int *)((long)puVar4 + (lVar6 >> 0x1e));
    *piVar1 = *piVar1 - (int)uVar8;
  }
  remove_leading_zeros(this);
  return;
}

Assistant:

FMT_CONSTEXPR void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j)
      subtract_bigits(i, other.bigits_[j], borrow);
    if (borrow != 0) subtract_bigits(i, 0, borrow);
    FMT_ASSERT(borrow == 0, "");
    remove_leading_zeros();
  }